

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
readStatus(void *handle,UA_NodeId nodeid,UA_Boolean sourceTimeStamp,UA_NumericRange *range,
          UA_DataValue *value)

{
  byte bVar1;
  undefined8 *puVar2;
  undefined1 local_40 [8];
  timeval tv;
  
  if (range == (UA_NumericRange *)0x0) {
    puVar2 = (undefined8 *)calloc(1,0x98);
    *puVar2 = *handle;
    gettimeofday((timeval *)local_40,(__timezone_ptr_t)0x0);
    puVar2[1] = (long)local_40 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
    UA_copy((void *)((long)handle + 0x88),puVar2 + 3,UA_TYPES + 0x3f);
    (value->value).type = (UA_DataType *)0x13fd60;
    (value->value).arrayLength = 0;
    (value->value).data = puVar2;
    (value->value).arrayDimensionsSize = 0;
    (value->value).arrayDimensions = (UA_UInt32 *)0x0;
    bVar1 = *(byte *)value;
    *(byte *)value = bVar1 | 1;
    if (sourceTimeStamp) {
      *(byte *)value = bVar1 | 5;
      gettimeofday((timeval *)local_40,(__timezone_ptr_t)0x0);
      value->sourceTimestamp = (long)local_40 * 10000000 + 0x19db1ded53e8000 + tv.tv_sec * 10;
    }
  }
  else {
    *(byte *)value = *(byte *)value | 2;
    value->status = 0x80360000;
  }
  return 0;
}

Assistant:

static UA_StatusCode
readStatus(void *handle, const UA_NodeId nodeid, UA_Boolean sourceTimeStamp,
           const UA_NumericRange *range, UA_DataValue *value) {
    if(range) {
        value->hasStatus = true;
        value->status = UA_STATUSCODE_BADINDEXRANGEINVALID;
        return UA_STATUSCODE_GOOD;
    }

    UA_Server *server = (UA_Server*)handle;
    UA_ServerStatusDataType *status = UA_ServerStatusDataType_new();
    status->startTime = server->startTime;
    status->currentTime = UA_DateTime_now();
    status->state = UA_SERVERSTATE_RUNNING;
    status->secondsTillShutdown = 0;
    UA_BuildInfo_copy(&server->config.buildInfo, &status->buildInfo);

    value->value.type = &UA_TYPES[UA_TYPES_SERVERSTATUSDATATYPE];
    value->value.arrayLength = 0;
    value->value.data = status;
    value->value.arrayDimensionsSize = 0;
    value->value.arrayDimensions = NULL;
    value->hasValue = true;
    if(sourceTimeStamp) {
        value->hasSourceTimestamp = true;
        value->sourceTimestamp = UA_DateTime_now();
    }
    return UA_STATUSCODE_GOOD;
}